

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int clear_float_zeros(char *str)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  long lVar5;
  
  __s = strchr(str,0x2e);
  if (__s == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar4 = strlen(__s);
    lVar1 = (long)(int)sVar4 + -1;
    lVar5 = lVar1;
    if (2 < (long)(int)sVar4) {
      do {
        if ((byte)(__s[lVar5] | 0x10U) != 0x30) goto LAB_0010ddf6;
        __s[lVar5] = '\0';
        bVar2 = 2 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar2);
      lVar5 = 1;
    }
LAB_0010ddf6:
    uVar3 = (uint)(lVar5 < lVar1);
  }
  return uVar3;
}

Assistant:

int clear_float_zeros( char * str )
{
   char * dp  = strchr(str, '.'), * valp;
   int    len;

   if( !dp ) return 0;      /* nothing to clear */

   len = strlen(dp);

   /* never clear what is just to the right of '.' */
   for( valp = dp+len-1; (valp > dp+1) && (*valp==' ' || *valp=='0'); valp-- )
       *valp = '\0';     /* clear, so we don't worry about break conditions */

   if( valp < dp + len - 1 ) return 1;
   return 0;
}